

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdType.cpp
# Opt level: O2

void __thiscall ArrayId::ArrayId(ArrayId *this,string *name,TYPE et,int dim,period *prd)

{
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  Id::Id(&this->super_Id,&sStack_48,_ARRAY);
  std::__cxx11::string::~string((string *)&sStack_48);
  this->dim = dim;
  this->element_type = et;
  this->prd = prd;
  return;
}

Assistant:

ArrayId::ArrayId(std::string name, TYPE et, int dim, period *prd)
    : Id(std::move(name), _ARRAY) {
    this->dim = dim;
    this->element_type = et;
    this->prd = prd;
}